

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

int main(int argc,char **argv)

{
  vector<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_> *this;
  pointer pdVar1;
  pointer pdVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  reference pvVar6;
  reference pvVar7;
  long lVar8;
  reference pvVar9;
  size_type __n;
  size_t idx_crd;
  size_type __n_00;
  size_type __n_01;
  Geometry_t geometry;
  topology_object_t topology;
  topojson_t topojson;
  Polygon_topojson_t polygon;
  
  if (argc < 2) {
    poVar5 = std::operator<<((ostream *)&std::cout,"usage : ./parser <GEOJSON file>");
    std::endl<char,std::char_traits<char>>(poVar5);
    iVar4 = 1;
  }
  else {
    topojson.translate[0] = 0.0;
    topojson.translate[1] = 0.0;
    topojson.scale[0] = 0.0;
    topojson.scale[1] = 0.0;
    topojson.m_arcs.super__Vector_base<arc_t,_std::allocator<arc_t>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    topojson.m_arcs.super__Vector_base<arc_t,_std::allocator<arc_t>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    topojson.m_topology.super__Vector_base<topology_object_t,_std::allocator<topology_object_t>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    topojson.m_arcs.super__Vector_base<arc_t,_std::allocator<arc_t>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    topojson.m_topology.super__Vector_base<topology_object_t,_std::allocator<topology_object_t>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    topojson.m_topology.super__Vector_base<topology_object_t,_std::allocator<topology_object_t>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    topojson.idx_geom = 0;
    iVar4 = topojson_t::convert(&topojson,argv[1]);
    if (iVar4 < 0) {
      iVar4 = 1;
    }
    else {
      if (topojson.m_topology.
          super__Vector_base<topology_object_t,_std::allocator<topology_object_t>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          topojson.m_topology.
          super__Vector_base<topology_object_t,_std::allocator<topology_object_t>_>._M_impl.
          super__Vector_impl_data._M_start) {
        topojson_t::make_coordinates(&topojson,0);
        pvVar6 = std::vector<topology_object_t,_std::allocator<topology_object_t>_>::at
                           (&topojson.m_topology,0);
        topology_object_t::topology_object_t(&topology,pvVar6);
        this = &geometry.m_polygon;
        for (__n = 0; __n != ((long)topology.m_geom.
                                    super__Vector_base<Geometry_t,_std::allocator<Geometry_t>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)topology.m_geom.
                                   super__Vector_base<Geometry_t,_std::allocator<Geometry_t>_>.
                                   _M_impl.super__Vector_impl_data._M_start) / 0x38; __n = __n + 1)
        {
          pvVar7 = std::vector<Geometry_t,_std::allocator<Geometry_t>_>::at(&topology.m_geom,__n);
          Geometry_t::Geometry_t(&geometry,pvVar7);
          bVar3 = is_polygon(&geometry);
          if (bVar3) {
            lVar8 = (long)geometry.m_polygon.
                          super__Vector_base<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)geometry.m_polygon.
                          super__Vector_base<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>
                          ._M_impl.super__Vector_impl_data._M_start;
            for (__n_01 = 0; __n_01 != lVar8 / 0x48; __n_01 = __n_01 + 1) {
              pvVar9 = std::vector<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>::at
                                 (this,__n_01);
              Polygon_topojson_t::Polygon_topojson_t(&polygon,pvVar9);
              pvVar9 = std::vector<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>::at
                                 (this,__n_01);
              pdVar1 = (pvVar9->m_y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish;
              pdVar2 = (pvVar9->m_y).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
              for (__n_00 = 0; (long)pdVar1 - (long)pdVar2 >> 3 != __n_00; __n_00 = __n_00 + 1) {
                pvVar9 = std::vector<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>::at
                                   (this,__n_01);
                std::vector<double,_std::allocator<double>_>::at(&pvVar9->m_y,__n_00);
                pvVar9 = std::vector<Polygon_topojson_t,_std::allocator<Polygon_topojson_t>_>::at
                                   (this,__n_01);
                std::vector<double,_std::allocator<double>_>::at(&pvVar9->m_x,__n_00);
              }
              Polygon_topojson_t::~Polygon_topojson_t(&polygon);
            }
          }
          Geometry_t::~Geometry_t(&geometry);
        }
        topology_object_t::~topology_object_t(&topology);
      }
      iVar4 = 0;
    }
    topojson_t::~topojson_t(&topojson);
  }
  return iVar4;
}

Assistant:

int main(int argc, char *argv[])
{
  if (argc < 2)
  {
    std::cout << "usage : ./parser <GEOJSON file>" << std::endl;
    return 1;
  }

  topojson_t topojson;
  if (topojson.convert(argv[1]) < 0)
  {
    return 1;
  }

  //no objects
  if (!topojson.m_topology.size())
  {
    return 0;
  }

  /////////////////////////////////////////////////////////////////////////////////////////////////////
  //must make the coordinates for the topology first; assume the first topology
  /////////////////////////////////////////////////////////////////////////////////////////////////////

  size_t topology_index = 0;
  topojson.make_coordinates(topology_index);
  topology_object_t topology = topojson.m_topology.at(topology_index);

  size_t size_geom = topology.m_geom.size();
  for (size_t idx_geom = 0; idx_geom < size_geom; idx_geom++)
  {
    Geometry_t geometry = topology.m_geom.at(idx_geom);
    if (is_polygon(geometry))
    {
      size_t size_pol = geometry.m_polygon.size();
      for (size_t idx_pol = 0; idx_pol < size_pol; idx_pol++)
      {
        Polygon_topojson_t polygon = geometry.m_polygon.at(idx_pol);

        //render

        size_t size_points = geometry.m_polygon.at(idx_pol).m_y.size();
        for (size_t idx_crd = 0; idx_crd < size_points; idx_crd++)
        {
          double lat = geometry.m_polygon.at(idx_pol).m_y.at(idx_crd);
          double lon = geometry.m_polygon.at(idx_pol).m_x.at(idx_crd);
        }

      }
    }
  }

  return 0;
}